

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

int __thiscall QCss::Selector::specificity(Selector *this)

{
  int iVar1;
  qsizetype *pqVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = (this->basicSelectors).d.size;
  pqVar2 = &(((this->basicSelectors).d.ptr)->attributeSelectors).d.size;
  iVar1 = 0;
  while( true ) {
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar4) break;
    iVar1 = ((iVar1 + 1) - (uint)(pqVar2[-9] == 0)) +
            *(int *)(pqVar2 + -6) * 0x100 + ((int)*pqVar2 + *(int *)(pqVar2 + -3)) * 0x10;
    pqVar2 = pqVar2 + 0xd;
  }
  return iVar1;
}

Assistant:

int Selector::specificity() const
{
    int val = 0;
    for (int i = 0; i < basicSelectors.size(); ++i) {
        const BasicSelector &sel = basicSelectors.at(i);
        if (!sel.elementName.isEmpty())
            val += 1;

        val += (sel.pseudos.size() + sel.attributeSelectors.size()) * 0x10;
        val += sel.ids.size() * 0x100;
    }
    return val;
}